

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPack.c
# Opt level: O3

void Gia_ManLutPacking(Gia_Man_t *p,int nBlockSize,int DelayRoute,int DelayDir,int fVerbose)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar7;
  void *__s;
  void *__s_00;
  Vec_Int_t *p_00;
  int *piVar8;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int *piVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  int Delays [32];
  int Perm [32];
  int local_138 [32];
  int local_b8 [34];
  int iVar6;
  
  pVVar7 = Gia_ManLutCollect(p);
  iVar15 = p->nObjs;
  lVar21 = (long)iVar15;
  iVar4 = 0x10;
  if (0xe < iVar15 - 1U) {
    iVar4 = iVar15;
  }
  if (iVar4 == 0) {
    __s = (void *)0x0;
    memset((void *)0x0,0,lVar21 * 4);
    __s_00 = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar4 << 2);
    memset(__s,0,lVar21 * 4);
    __s_00 = malloc((long)iVar4 << 2);
  }
  memset(__s_00,0,lVar21 * 4);
  uVar14 = pVVar7->nSize;
  iVar20 = (int)(uVar14 * 2) / nBlockSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar20 - 1U) {
    iVar4 = iVar20;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar8;
  uVar17 = 0;
  if ((int)uVar14 < 1) {
    uVar19 = 0;
LAB_00707544:
    bVar2 = false;
    uVar5 = 0;
  }
  else {
    piVar8 = pVVar7->pArray;
    uVar19 = 0;
    uVar17 = 0;
    do {
      iVar4 = piVar8[uVar19];
      lVar21 = (long)iVar4;
      if (lVar21 < 0) goto LAB_007078b5;
      uVar5 = p->vMapping->nSize;
      if ((int)uVar5 <= iVar4) goto LAB_007078b5;
      piVar9 = p->vMapping->pArray;
      lVar10 = (long)piVar9[lVar21];
      if ((lVar10 < 0) || (uVar5 <= (uint)piVar9[lVar21])) goto LAB_007078b5;
      iVar20 = piVar9[lVar10];
      lVar13 = (long)iVar20;
      if (0x20 < lVar13) {
        __assert_fail("nSize <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPack.c"
                      ,0x8a,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
      }
      if (iVar20 < 1) {
LAB_00707403:
        bVar2 = false;
      }
      else {
        lVar11 = 0;
        do {
          iVar6 = piVar9[lVar10 + lVar11 + 1];
          if (((long)iVar6 < 0) || (iVar15 <= iVar6)) goto LAB_007078b5;
          local_138[lVar11] = *(int *)((long)__s + (long)iVar6 * 4);
          local_b8[lVar11] = iVar6;
          lVar11 = lVar11 + 1;
        } while (lVar13 != lVar11);
        bVar2 = iVar20 != 1;
        if (iVar20 == 1) goto LAB_00707403;
        lVar10 = 1;
        uVar12 = 0;
        do {
          uVar16 = uVar12 & 0xffffffff;
          lVar11 = lVar10;
          do {
            uVar5 = (uint)lVar11;
            if (local_138[lVar11] <= local_138[(int)(uint)uVar16]) {
              uVar5 = (uint)uVar16;
            }
            lVar11 = lVar11 + 1;
            uVar16 = (ulong)uVar5;
          } while (lVar13 != lVar11);
          iVar6 = local_b8[uVar12];
          local_b8[uVar12] = local_b8[(int)uVar5];
          iVar1 = local_138[uVar12];
          local_138[uVar12] = local_138[(int)uVar5];
          uVar12 = uVar12 + 1;
          local_b8[(int)uVar5] = iVar6;
          local_138[(int)uVar5] = iVar1;
          lVar10 = lVar10 + 1;
        } while (uVar12 != iVar20 - 1);
        if (local_138[0] < local_138[iVar20 - 1]) {
          __assert_fail("nSize < 2 || Delays[0] >= Delays[nSize-1]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPack.c"
                        ,0x91,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
        }
      }
      iVar20 = local_138[0];
      if ((local_138[0] < 0) || (local_138[lVar13 + -1] < 0)) {
        __assert_fail("Delays[0] >= 0 && Delays[nSize-1] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPack.c"
                      ,0x92,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
      }
      if (((long)local_b8[0] < 0) || (iVar15 <= local_b8[0])) goto LAB_007078b5;
      if ((local_138[0] == 0) || (local_138[0] <= local_138[1])) {
LAB_00707484:
        if (iVar15 <= iVar4) goto LAB_007078d4;
        *(int *)((long)__s_00 + lVar21 * 4) = p_00->nSize;
        Vec_IntPush(p_00,1);
        iVar6 = DelayRoute;
      }
      else {
        uVar5 = *(uint *)((long)__s_00 + (long)local_b8[0] * 4);
        if (((int)uVar5 < 0) || (p_00->nSize <= (int)uVar5)) goto LAB_007078b5;
        piVar9 = p_00->pArray;
        iVar6 = piVar9[uVar5];
        if (nBlockSize <= iVar6) goto LAB_00707484;
        if (iVar15 <= iVar4) goto LAB_007078d4;
        *(uint *)((long)__s_00 + lVar21 * 4) = uVar5;
        piVar9[uVar5] = iVar6 + 1;
        iVar6 = DelayDir;
      }
      uVar5 = iVar6 + iVar20;
      if (bVar2) {
        lVar10 = 1;
        do {
          if ((int)uVar5 <= local_138[lVar10] + DelayRoute) {
            uVar5 = local_138[lVar10] + DelayRoute;
          }
          lVar10 = lVar10 + 1;
        } while (lVar13 != lVar10);
      }
      if (iVar15 <= iVar4) {
LAB_007078d4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(uint *)((long)__s + lVar21 * 4) = uVar5;
      uVar3 = (uint)uVar17;
      if ((int)(uint)uVar17 <= (int)uVar5) {
        uVar3 = uVar5;
      }
      uVar17 = (ulong)uVar3;
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar14);
    uVar19 = (ulong)p_00->nSize;
    bVar2 = 0 < (long)uVar19;
    if ((long)uVar19 < 1) goto LAB_00707544;
    uVar12 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + p_00->pArray[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar19 != uVar12);
  }
  if (uVar5 != uVar14) {
    __assert_fail("Vec_IntSum(vBSize) == Vec_IntSize(vOrder)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPack.c"
                  ,0xa7,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
  }
  iVar4 = (int)uVar19;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar20 = uVar14 + iVar4 + 1;
  if (uVar14 + iVar4 < 0xf) {
    iVar20 = 0x10;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar20;
  if (iVar20 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar20 << 2);
  }
  p_01->pArray = piVar8;
  Vec_IntPush(p_01,iVar4);
  p_02 = (Vec_Int_t *)malloc(0x10);
  iVar20 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar20 = iVar4;
  }
  p_02->nSize = 0;
  p_02->nCap = iVar20;
  if (iVar20 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar20 << 2);
  }
  p_02->pArray = piVar8;
  if (bVar2) {
    piVar8 = p_00->pArray;
    uVar12 = 0;
    do {
      iVar4 = piVar8[uVar12];
      Vec_IntPush(p_01,iVar4);
      iVar20 = p_01->nSize;
      Vec_IntPush(p_02,iVar20);
      if (0 < iVar4) {
        iVar6 = iVar20 + iVar4;
        iVar1 = p_01->nCap;
        iVar18 = iVar1 * 2;
        if (iVar18 < iVar6) {
          if (iVar1 < iVar6) {
            if (p_01->pArray == (int *)0x0) {
              piVar9 = (int *)malloc((long)iVar6 << 2);
            }
            else {
              piVar9 = (int *)realloc(p_01->pArray,(long)iVar6 << 2);
            }
            p_01->pArray = piVar9;
            iVar18 = iVar6;
LAB_007076b3:
            if (piVar9 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            p_01->nCap = iVar18;
          }
        }
        else if (iVar1 < iVar6) {
          if (p_01->pArray == (int *)0x0) {
            piVar9 = (int *)malloc((long)iVar1 << 3);
          }
          else {
            piVar9 = (int *)realloc(p_01->pArray,(long)iVar1 << 3);
          }
          p_01->pArray = piVar9;
          goto LAB_007076b3;
        }
        memset(p_01->pArray + iVar20,0xff,(ulong)(iVar4 - 1) * 4 + 4);
        p_01->nSize = iVar6;
      }
      uVar12 = uVar12 + 1;
    } while ((uVar19 & 0xffffffff) != uVar12);
  }
  if ((p_01->nCap != 0x10) && (p_01->nSize != p_01->nCap)) {
    __assert_fail("Vec_IntCap(vPacking) == 16 || Vec_IntSize(vPacking) == Vec_IntCap(vPacking)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPack.c"
                  ,0xb3,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
  }
  if ((int)uVar14 < 1) {
    uVar14 = p_01->nSize;
    if (0 < (int)uVar14) goto LAB_007077a8;
  }
  else {
    piVar8 = pVVar7->pArray;
    uVar19 = (ulong)uVar14 + 1;
    do {
      iVar4 = piVar8[uVar19 - 2];
      if (((long)iVar4 < 0) || (iVar15 <= iVar4)) {
LAB_007078b5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar20 = *(int *)((long)__s_00 + (long)iVar4 * 4);
      lVar21 = (long)iVar20;
      if ((lVar21 < 0) || (p_02->nSize <= iVar20)) goto LAB_007078b5;
      piVar9 = p_02->pArray;
      iVar20 = piVar9[lVar21];
      lVar10 = (long)iVar20;
      if ((lVar10 < 0) || (uVar14 = p_01->nSize, (int)uVar14 <= iVar20)) goto LAB_007078b5;
      if (p_01->pArray[lVar10] != -1) {
        __assert_fail("Vec_IntEntry(vPacking, Start) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPack.c"
                      ,0xb9,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
      }
      p_01->pArray[lVar10] = iVar4;
      piVar9 = piVar9 + lVar21;
      *piVar9 = *piVar9 + 1;
      uVar19 = uVar19 - 1;
    } while (1 < uVar19);
LAB_007077a8:
    uVar19 = 0;
    iVar15 = 0;
    do {
      iVar15 = iVar15 + (uint)(p_01->pArray[uVar19] == -1);
      uVar19 = uVar19 + 1;
    } while (uVar14 != uVar19);
    if (iVar15 != 0) {
      __assert_fail("Vec_IntCountEntry(vPacking, -1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPack.c"
                    ,0xbd,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
    }
  }
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
  }
  free(p_02);
  pVVar7 = p->vPacking;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vPacking->pArray = (int *)0x0;
      pVVar7 = p->vPacking;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00707885;
    }
    free(pVVar7);
  }
LAB_00707885:
  p->vPacking = p_01;
  printf("Global delay = %d.\n",uVar17);
  return;
}

Assistant:

void Gia_ManLutPacking( Gia_Man_t * p, int nBlockSize, int DelayRoute, int DelayDir, int fVerbose )
{
    int Delays[32], Perm[32];
    Vec_Int_t * vPacking, * vStarts;
    Vec_Int_t * vOrder = Gia_ManLutCollect( p );
    Vec_Int_t * vDelay = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vBlock = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vBSize = Vec_IntAlloc( 2 * Vec_IntSize(vOrder) / nBlockSize );
    int i, k, Id, iFan, nSize, iBlock, Delay, DelayMax = 0;
    // create blocks
    Vec_IntForEachEntry( vOrder, Id, i )
    {
        nSize = Gia_ObjLutSize( p, Id );
        assert( nSize <= 32 );
        Gia_LutForEachFanin( p, Id, iFan, k )
        {
            Delays[k] = Vec_IntEntry(vDelay, iFan);
            Perm[k] = iFan;
        }
        Vec_IntSelectSortCost2Reverse( Perm, nSize, Delays );
        assert( nSize < 2 || Delays[0] >= Delays[nSize-1] );
        assert( Delays[0] >= 0 && Delays[nSize-1] >= 0 );
        // check if we can reduce delay by adding it to the same bin as the latest one
        iBlock = Vec_IntEntry( vBlock, Perm[0] );
        if ( Delays[0] > 0 && Delays[0] > Delays[1] && Vec_IntEntry(vBSize, iBlock) < nBlockSize )
        {
            Delay = Delays[0] + DelayDir;
            Vec_IntWriteEntry( vBlock, Id, iBlock );
            Vec_IntAddToEntry( vBSize, iBlock, 1 );
        }
        else // clean new block
        {
            Delay = Delays[0] + DelayRoute;
            Vec_IntWriteEntry( vBlock, Id, Vec_IntSize(vBSize) );
            Vec_IntPush( vBSize, 1 );
        }
        // calculate delay
        for ( k = 1; k < nSize; k++ )
            Delay = Abc_MaxInt( Delay, Delays[k] + DelayRoute );
        Vec_IntWriteEntry( vDelay, Id, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    assert( Vec_IntSum(vBSize) == Vec_IntSize(vOrder) );
    // create packing info
    vPacking = Vec_IntAlloc( Vec_IntSize(vBSize) + Vec_IntSize(vOrder) + 1 );
    Vec_IntPush( vPacking, Vec_IntSize(vBSize) );
    // create starting places for each block
    vStarts = Vec_IntAlloc( Vec_IntSize(vBSize) );
    Vec_IntForEachEntry( vBSize, nSize, i )
    {
        Vec_IntPush( vPacking, nSize );
        Vec_IntPush( vStarts, Vec_IntSize(vPacking) );
        Vec_IntFillExtra( vPacking, Vec_IntSize(vPacking) + nSize, -1 );
    }
    assert( Vec_IntCap(vPacking) == 16 || Vec_IntSize(vPacking) == Vec_IntCap(vPacking) );
    // collect LUTs from the block
    Vec_IntForEachEntryReverse( vOrder, Id, i )
    {
        int Block = Vec_IntEntry( vBlock, Id );
        int Start = Vec_IntEntry( vStarts, Block );
        assert( Vec_IntEntry(vPacking, Start) == -1 );
        Vec_IntWriteEntry( vPacking, Start, Id );
        Vec_IntAddToEntry( vStarts, Block, 1 );
    }
    assert( Vec_IntCountEntry(vPacking, -1) == 0 );
    // cleanup
    Vec_IntFree( vOrder );
    Vec_IntFree( vDelay );
    Vec_IntFree( vBlock );
    Vec_IntFree( vBSize );
    Vec_IntFree( vStarts );
    Vec_IntFreeP( &p->vPacking );
    p->vPacking = vPacking;
    printf( "Global delay = %d.\n", DelayMax );
}